

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void gvr::anon_unknown_3::readASCIIElement(streambuf *in,char *out,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = std::streambuf::sgetc();
  while (iVar1 != -1) {
    iVar2 = isspace(iVar1);
    if (iVar2 == 0) break;
    iVar1 = std::streambuf::snextc();
  }
  iVar2 = 0;
  while (iVar1 != -1) {
    iVar3 = isspace(iVar1);
    if (iVar3 != 0) break;
    if (iVar2 < 0x27) {
      out[iVar2] = (char)iVar1;
      iVar2 = iVar2 + 1;
    }
    iVar1 = std::streambuf::snextc();
  }
  out[iVar2] = '\0';
  return;
}

Assistant:

void readASCIIElement(std::streambuf *in, char *out, int n)
{
  // eat white spaces

  int c=in->sgetc();

  while (c != EOF && isspace(c))
  {
    c=in->snextc();
  }

  // read until next white space or end of file

  n--;
  int i=0;

  while (c != EOF && !isspace(c))
  {
    if (i < n)
    {
      out[i++]=static_cast<char>(c);
    }

    c=in->snextc();
  }

  out[i]='\0';
}